

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void PredictorAdd1_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  __m128i res;
  __m128i sum1;
  __m128i shift1;
  __m128i sum0;
  __m128i shift0;
  __m128i src;
  __m128i prev;
  int i;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_dc;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  
  uVar2 = *(undefined4 *)(in_RCX + -4);
  local_f8 = CONCAT44(uVar2,uVar2);
  uStack_f0 = CONCAT44(uVar2,uVar2);
  for (local_dc = 0; local_dc + 4 <= in_EDX; local_dc = local_dc + 4) {
    puVar1 = (undefined8 *)(in_RDI + (long)local_dc * 4);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    local_38 = (char)uVar3;
    cStack_37 = (char)((ulong)uVar3 >> 8);
    cStack_36 = (char)((ulong)uVar3 >> 0x10);
    cStack_35 = (char)((ulong)uVar3 >> 0x18);
    cStack_34 = (char)((ulong)uVar3 >> 0x20);
    cStack_33 = (char)((ulong)uVar3 >> 0x28);
    cStack_32 = (char)((ulong)uVar3 >> 0x30);
    cStack_31 = (char)((ulong)uVar3 >> 0x38);
    cStack_30 = (char)uVar4;
    cStack_2f = (char)((ulong)uVar4 >> 8);
    cStack_2e = (char)((ulong)uVar4 >> 0x10);
    cStack_2d = (char)((ulong)uVar4 >> 0x18);
    cStack_2c = (char)((ulong)uVar4 >> 0x20);
    cStack_2b = (char)((ulong)uVar4 >> 0x28);
    cStack_2a = (char)((ulong)uVar4 >> 0x30);
    cStack_29 = (char)((ulong)uVar4 >> 0x38);
    local_88 = (char)local_f8;
    cStack_87 = (char)((ulong)local_f8 >> 8);
    cStack_86 = (char)((ulong)local_f8 >> 0x10);
    cStack_85 = (char)((ulong)local_f8 >> 0x18);
    cStack_84 = (char)((ulong)local_f8 >> 0x20);
    cStack_83 = (char)((ulong)local_f8 >> 0x28);
    cStack_82 = (char)((ulong)local_f8 >> 0x30);
    cStack_81 = (char)((ulong)local_f8 >> 0x38);
    cStack_80 = (char)uStack_f0;
    cStack_7f = (char)((ulong)uStack_f0 >> 8);
    cStack_7e = (char)((ulong)uStack_f0 >> 0x10);
    cStack_7d = (char)((ulong)uStack_f0 >> 0x18);
    cStack_7c = (char)((ulong)uStack_f0 >> 0x20);
    cStack_7b = (char)((ulong)uStack_f0 >> 0x28);
    cStack_7a = (char)((ulong)uStack_f0 >> 0x30);
    cStack_79 = (char)((ulong)uStack_f0 >> 0x38);
    cStack_7c = cStack_2c + cStack_30 + cStack_34 + local_38 + cStack_7c;
    cStack_7b = cStack_2b + cStack_2f + cStack_33 + cStack_37 + cStack_7b;
    cStack_7a = cStack_2a + cStack_2e + cStack_32 + cStack_36 + cStack_7a;
    cStack_79 = cStack_29 + cStack_2d + cStack_31 + cStack_35 + cStack_79;
    puVar1 = (undefined8 *)(in_RCX + (long)local_dc * 4);
    *puVar1 = CONCAT17(cStack_31 + cStack_35 + cStack_81,
                       CONCAT16(cStack_32 + cStack_36 + cStack_82,
                                CONCAT15(cStack_33 + cStack_37 + cStack_83,
                                         CONCAT14(cStack_34 + local_38 + cStack_84,
                                                  CONCAT13(cStack_35 + cStack_85,
                                                           CONCAT12(cStack_36 + cStack_86,
                                                                    CONCAT11(cStack_37 + cStack_87,
                                                                             local_38 + local_88))))
                                        )));
    puVar1[1] = CONCAT17(cStack_79,
                         CONCAT16(cStack_7a,
                                  CONCAT15(cStack_7b,
                                           CONCAT14(cStack_7c,
                                                    CONCAT13(cStack_2d + cStack_31 + cStack_35 +
                                                             cStack_7d,
                                                             CONCAT12(cStack_2e + cStack_32 +
                                                                      cStack_36 + cStack_7e,
                                                                      CONCAT11(cStack_2f + cStack_33
                                                                               + cStack_37 +
                                                                               cStack_7f,
                                                                               cStack_30 + cStack_34
                                                                               + local_38 +
                                                                               cStack_80)))))));
    uVar2 = CONCAT13(cStack_79,CONCAT12(cStack_7a,CONCAT11(cStack_7b,cStack_7c)));
    local_f8 = CONCAT44(uVar2,uVar2);
    uStack_f0 = CONCAT44(uVar2,uVar2);
  }
  if (local_dc != in_EDX) {
    (*VP8LPredictorsAdd_C[1])
              ((uint32_t *)(in_RDI + (long)local_dc * 4),(uint32_t *)(in_RSI + (long)local_dc * 4),
               in_EDX - local_dc,(uint32_t *)(in_RCX + (long)local_dc * 4));
  }
  return;
}

Assistant:

static void PredictorAdd1_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i prev = _mm_set1_epi32((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // a | b | c | d
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    // 0 | a | b | c
    const __m128i shift0 = _mm_slli_si128(src, 4);
    // a | a + b | b + c | c + d
    const __m128i sum0 = _mm_add_epi8(src, shift0);
    // 0 | 0 | a | a + b
    const __m128i shift1 = _mm_slli_si128(sum0, 8);
    // a | a + b | a + b + c | a + b + c + d
    const __m128i sum1 = _mm_add_epi8(sum0, shift1);
    const __m128i res = _mm_add_epi8(sum1, prev);
    _mm_storeu_si128((__m128i*)&out[i], res);
    // replicate prev output on the four lanes
    prev = _mm_shuffle_epi32(res, (3 << 0) | (3 << 2) | (3 << 4) | (3 << 6));
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[1](in + i, upper + i, num_pixels - i, out + i);
  }
}